

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerUtil.h
# Opt level: O2

void __thiscall
jaegertracing::testutils::TracerUtil::ResourceHandle::~ResourceHandle(ResourceHandle *this)

{
  undefined1 local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  undefined1 local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  opentracing::v3::MakeNoopTracer();
  opentracing::v3::Tracer::InitGlobal(local_20,local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_mockAgent).
              super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~ResourceHandle()
    {
        opentracing::Tracer::InitGlobal(opentracing::MakeNoopTracer());
    }